

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O1

int testSpanTestsSlicingIllegalBounds(void)

{
  ostream *poVar1;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> values;
  Span<int,_18446744073709551615UL> span;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> local_40;
  Span<int,_18446744073709551615UL> local_28;
  
  local_28.m_ptr = (pointer)0x200000001;
  local_28.m_size.m_size = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,&local_41);
  local_28.m_ptr = (pointer)0x0;
  if ((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_28.m_ptr =
         local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_28.m_size.m_size =
       (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&local_28,4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
             ,0x71);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,0x1ec);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,": expected exception, but none thrown.\n",0x27);
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 1;
}

Assistant:

int testSpanTestsSlicingIllegalBounds()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);
    ML_ASSERT_THROWS(span.Slice(4), std::range_error);
    ML_ASSERT_THROWS(span.Slice(0, 6), std::range_error);

    return 0;
}